

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O0

time_t time2epoch(int sec,int min,int hour,int mday,int mon,int year)

{
  int iVar1;
  int leap_days;
  int year_local;
  int mon_local;
  int mday_local;
  int hour_local;
  int min_local;
  int sec_local;
  
  iVar1 = year - (uint)(mon < 2);
  return ((((long)(year + -0x7b2) * 0x16d + (long)((iVar1 / 4 - iVar1 / 100) + iVar1 / 400 + -0x1dd)
            + (long)time2epoch::month_days_cumulative[mon] + (long)mday + -1) * 0x18 + (long)hour) *
          0x3c + (long)min) * 0x3c + (long)sec;
}

Assistant:

static time_t time2epoch(int sec, int min, int hour,
                         int mday, int mon, int year)
{
  static const int month_days_cumulative [12] =
    { 0, 31, 59, 90, 120, 151, 181, 212, 243, 273, 304, 334 };
  int leap_days = year - (mon <= 1);
  leap_days = ((leap_days / 4) - (leap_days / 100) + (leap_days / 400)
               - (1969 / 4) + (1969 / 100) - (1969 / 400));
  return ((((time_t) (year - 1970) * 365
            + leap_days + month_days_cumulative[mon] + mday - 1) * 24
           + hour) * 60 + min) * 60 + sec;
}